

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31InfoTests.cpp
# Opt level: O0

int __thiscall deqp::gles31::InfoTests::init(InfoTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  QueryStringCase *pQVar1;
  TestNode *pTVar2;
  InfoTests *this_local;
  
  pQVar1 = (QueryStringCase *)operator_new(0x80);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_context,"vendor","Vendor String",0x1f00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pQVar1 = (QueryStringCase *)operator_new(0x80);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_context,"renderer","Renderer String",0x1f01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pQVar1 = (QueryStringCase *)operator_new(0x80);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_context,"version","Version String",0x1f02);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pQVar1 = (QueryStringCase *)operator_new(0x80);
  QueryStringCase::QueryStringCase
            (pQVar1,(this->super_TestCaseGroup).m_context,"shading_language_version",
             "Shading Language Version String",0x8b8c);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pQVar1);
  pTVar2 = (TestNode *)operator_new(0x78);
  QueryExtensionsCase::QueryExtensionsCase
            ((QueryExtensionsCase *)pTVar2,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  RenderTargetInfoCase::RenderTargetInfoCase
            ((RenderTargetInfoCase *)pTVar2,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void InfoTests::init (void)
{
	addChild(new QueryStringCase(m_context, "vendor",					"Vendor String",					GL_VENDOR));
	addChild(new QueryStringCase(m_context, "renderer",					"Renderer String",					GL_RENDERER));
	addChild(new QueryStringCase(m_context, "version",					"Version String",					GL_VERSION));
	addChild(new QueryStringCase(m_context, "shading_language_version",	"Shading Language Version String",	GL_SHADING_LANGUAGE_VERSION));
	addChild(new QueryExtensionsCase(m_context));
	addChild(new RenderTargetInfoCase(m_context));
}